

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

sqlite3 * qMakeError(sqlite3 *access,QString *descr,ErrorType type,int errorCode)

{
  QChar *pQVar1;
  undefined4 in_register_00000014;
  int in_R8D;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QChar *)sqlite3_errmsg16((sqlite3 *)descr);
  QString::QString((QString *)&local_50,pQVar1,-1);
  QString::number((int)&QStack_68,in_R8D);
  QSqlError::QSqlError
            ((QSqlError *)access,(QString *)CONCAT44(in_register_00000014,type),(QString *)&local_50
             ,errorCode,(QString *)&QStack_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return access;
  }
  __stack_chk_fail();
}

Assistant:

static QSqlError qMakeError(sqlite3 *access, const QString &descr, QSqlError::ErrorType type,
                            int errorCode)
{
    return QSqlError(descr,
                     QString(reinterpret_cast<const QChar *>(sqlite3_errmsg16(access))),
                     type, QString::number(errorCode));
}